

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

gnode_t * parse_import_statement(gravity_parser_t *parser)

{
  gravity_lexer_t *lexer;
  gravity_parser_t *parser_local;
  
  gravity_lexer_next(parser->lexer->p[parser->lexer->n - 1]);
  return (gnode_t *)0x0;
}

Assistant:

static gnode_t *parse_import_statement (gravity_parser_t *parser) {
    #pragma unused(parser)
    DEBUG_PARSER("parse_import_statement");
    DECLARE_LEXER;

    // import is a syntactic sugar for System.import
    gravity_lexer_next(lexer);
    return NULL;
}